

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi_is_hdr(char *filename)

{
  int iVar1;
  FILE *__stream;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = stbi_is_hdr_from_file((FILE *)__stream);
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_hdr(char const *filename)
{
    FILE *f = stbi__fopen(filename, "rb");
    int result = 0;
    if (f)
    {
        result = stbi_is_hdr_from_file(f);
        fclose(f);
    }
    return result;
}